

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

double * __thiscall google::protobuf::RepeatedField<double>::elements(RepeatedField<double> *this)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this->total_size_ < 1) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x161);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (total_size_) > (0): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return (double *)this->arena_or_elements_;
}

Assistant:

Element* elements() const {
    GOOGLE_DCHECK_GT(total_size_, 0);
    // Because of above pre-condition this cast is safe.
    return unsafe_elements();
  }